

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O1

pair<unsigned_int,_unsigned_int>
deqp::gls::anon_unknown_1::createAndAttachShaders
          (TestLog *log,RenderContext *renderCtx,deUint32 program,
          vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
          *attributes,bool attributeAliasing)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Cond *pCVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  ContextType CVar10;
  GLSLVersion GVar11;
  deUint32 dVar12;
  undefined4 extraout_var;
  ostream *poVar13;
  long *plVar14;
  undefined8 *puVar15;
  ostream *poVar16;
  _Rb_tree_node_base *p_Var17;
  char *pcVar18;
  mapped_type *pmVar19;
  pointer pcVar20;
  char *__s;
  pair<unsigned_int,_unsigned_int> pVar21;
  TestError *this_00;
  deUint32 shader;
  long *plVar22;
  size_type *psVar23;
  undefined8 uVar24;
  char *pcVar25;
  _Alloc_hider *p_Var26;
  pointer pAVar27;
  undefined7 in_register_00000081;
  uint uVar28;
  GLSLVersion version;
  Cond *pCVar29;
  Attribute *pAVar30;
  string fragmentShaderSource;
  size_type __dnew_2;
  size_type __dnew_4;
  ostringstream src_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  parameters;
  StringTemplate vertexShaderTemplate;
  string vertexShaderSource;
  ostringstream src;
  undefined1 local_5f0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d8;
  deUint32 local_5c4;
  size_type *local_5c0;
  _Alloc_hider local_5b8;
  size_type local_5b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_5a8;
  string local_598;
  ScopedLogSection local_578;
  long local_570;
  TestLog local_568 [2];
  int local_558;
  GLSLVersion local_554;
  undefined1 local_550 [8];
  _Alloc_hider local_548;
  undefined1 local_540 [16];
  undefined3 local_530;
  undefined5 uStack_52d;
  size_t local_528;
  ios_base local_4e0 [264];
  long *local_3d8;
  long local_3d0;
  long local_3c8;
  long lStack_3c0;
  undefined1 local_3b8 [8];
  undefined1 local_3b0 [24];
  _Base_ptr local_398;
  size_t local_390;
  ios_base local_348 [8];
  ios_base local_340 [264];
  StringTemplate local_238;
  RenderContext *local_218;
  ostream *local_210;
  string local_208;
  long *local_1e8 [2];
  long local_1d8 [2];
  string local_1c8;
  key_type local_1a8 [3];
  ios_base local_138 [264];
  _anonymous_namespace_ *this;
  
  local_5c4 = program;
  iVar9 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  this = (_anonymous_namespace_ *)CONCAT44(extraout_var,iVar9);
  local_218 = renderCtx;
  CVar10.super_ApiType.m_bits = (ApiType)(*renderCtx->_vptr_RenderContext[2])(renderCtx);
  GVar11 = glu::getContextTypeGLSLVersion(CVar10);
  local_558 = (int)CONCAT71(in_register_00000081,attributeAliasing);
  if (local_558 == 0) {
LAB_004cb930:
    local_554 = GVar11;
  }
  else {
    bVar6 = glu::glslVersionIsES(GVar11);
    local_554 = GLSL_VERSION_100_ES;
    if (!bVar6) goto LAB_004cb930;
  }
  bVar6 = glu::glslVersionUsesInOutQualifiers(local_554);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"${VERSION}\n${VTX_OUTPUT} mediump vec4 v_color;\n",0x2f);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_550);
  pAVar27 = (attributes->
            super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pAVar27 !=
      (attributes->
      super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (pAVar27->m_layoutLocation != -1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_550,"layout(location = ",0x12);
        poVar13 = (ostream *)
                  std::ostream::operator<<((ostream *)local_550,pAVar27->m_layoutLocation);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,") ",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_550,"${VTX_INPUT} mediump ",0x15);
      pcVar20 = (pAVar27->m_type).m_name._M_dataplus._M_p;
      local_5f0._0_8_ = local_5f0 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_5f0,pcVar20,pcVar20 + (pAVar27->m_type).m_name._M_string_length);
      local_5d8._8_4_ = (pAVar27->m_type).m_locationSize;
      local_5d8._12_4_ = (pAVar27->m_type).m_glTypeEnum;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_550,(char *)local_5f0._0_8_,local_5f0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,(pAVar27->m_name)._M_dataplus._M_p,
                           (pAVar27->m_name)._M_string_length);
      iVar9 = pAVar27->m_arraySize;
      if (iVar9 == -1) {
        psVar23 = &local_5b0;
        p_Var26 = &local_5b8;
        local_5c0 = psVar23;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
        std::ostream::operator<<((ostringstream *)local_3b8,iVar9);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
        std::ios_base::~ios_base(local_348);
        plVar14 = (long *)std::__cxx11::string::replace((ulong)local_1e8,0,(char *)0x0,0x66a921);
        local_3d8 = &local_3c8;
        plVar22 = plVar14 + 2;
        if ((long *)*plVar14 == plVar22) {
          local_3c8 = *plVar22;
          lStack_3c0 = plVar14[3];
        }
        else {
          local_3c8 = *plVar22;
          local_3d8 = (long *)*plVar14;
        }
        local_3d0 = plVar14[1];
        *plVar14 = (long)plVar22;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_3d8);
        local_5c0 = &local_5b0;
        psVar23 = puVar15 + 2;
        if ((size_type *)*puVar15 == psVar23) {
          local_5b0 = *psVar23;
          aStack_5a8._M_allocated_capacity = puVar15[3];
        }
        else {
          local_5b0 = *psVar23;
          local_5c0 = (size_type *)*puVar15;
        }
        p_Var26 = (_Alloc_hider *)(puVar15 + 1);
        local_5b8._M_p = (pointer)puVar15[1];
        *puVar15 = psVar23;
      }
      p_Var26->_M_p = (pointer)0x0;
      *(undefined1 *)psVar23 = 0;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,(char *)local_5c0,(long)local_5b8._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,";\n",2);
      if (local_5c0 != &local_5b0) {
        operator_delete(local_5c0,local_5b0 + 1);
      }
      if (iVar9 != -1) {
        if (local_3d8 != &local_3c8) {
          operator_delete(local_3d8,local_3c8 + 1);
        }
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
      }
      if ((undefined1 *)local_5f0._0_8_ != local_5f0 + 0x10) {
        operator_delete((void *)local_5f0._0_8_,local_5f0._16_8_ + 1);
      }
      pAVar27 = pAVar27 + 1;
    } while (pAVar27 !=
             (attributes->
             super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_550);
  std::ios_base::~ios_base(local_4e0);
  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_598._M_dataplus._M_p,local_598._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
  local_210 = poVar13;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
  local_548._M_p = (pointer)((ulong)local_548._M_p._4_4_ << 0x20);
  local_540._0_4_ = 0;
  local_540._4_4_ = 0;
  local_540[8] = SUB81((_Base_ptr)&local_548,0);
  local_540[9] = (undefined1)((ulong)&local_548 >> 8);
  local_540[10] = (undefined1)((ulong)&local_548 >> 0x10);
  local_540._11_4_ = (undefined4)((ulong)&local_548 >> 0x18);
  local_540[0xf] = (undefined1)((ulong)&local_548 >> 0x38);
  local_528 = 0;
  pAVar27 = (attributes->
            super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
            )._M_impl.super__Vector_impl_data._M_start;
  _local_530 = (_Base_ptr)&local_548;
  if (pAVar27 !=
      (attributes->
      super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    pCVar29 = &pAVar27->m_cond;
    do {
      bVar8 = false;
      local_5f0._0_8_ = local_5f0._0_8_ & 0xffffffffffffff00;
      local_5d8._M_allocated_capacity = 0x737961776c615f5f;
      local_5f0._16_8_ = 10;
      local_5d8._8_3_ = 0x5f5f;
      local_5f0._8_8_ = &local_5d8;
      bVar7 = AttributeLocationTestUtil::Cond::operator==(pCVar29,(Cond *)local_5f0);
      if (!bVar7) {
        local_5c0 = (size_type *)CONCAT71(local_5c0._1_7_,1);
        aStack_5a8._M_allocated_capacity = 0x737961776c615f5f;
        aStack_5a8._8_2_ = 0x5f5f;
        local_5b0 = 10;
        aStack_5a8._M_local_buf[10] = '\0';
        local_5b8._M_p = (pointer)&aStack_5a8;
        bVar8 = AttributeLocationTestUtil::Cond::operator==(pCVar29,(Cond *)&local_5c0);
        bVar8 = !bVar8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b8._M_p != &aStack_5a8) {
          operator_delete(local_5b8._M_p,aStack_5a8._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f0._8_8_ != &local_5d8) {
        operator_delete((void *)local_5f0._8_8_,local_5d8._M_allocated_capacity + 1);
      }
      if (bVar8) {
        local_5f0._0_8_ = local_5f0 + 0x10;
        pcVar20 = (pCVar29->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5f0,pcVar20,pcVar20 + (pCVar29->m_name)._M_string_length);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_550,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0);
        if ((undefined1 *)local_5f0._0_8_ != local_5f0 + 0x10) {
          operator_delete((void *)local_5f0._0_8_,local_5f0._16_8_ + 1);
        }
      }
      pCVar2 = pCVar29 + 1;
      pCVar29 = (Cond *)&pCVar29[3].m_name;
    } while ((pointer)&pCVar2->m_name !=
             (attributes->
             super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  poVar13 = local_210;
  p_Var17 = (_Rb_tree_node_base *)
            CONCAT17(local_540[0xf],
                     CONCAT43(local_540._11_4_,
                              CONCAT12(local_540[10],CONCAT11(local_540[9],local_540[8]))));
  if (p_Var17 != (_Rb_tree_node_base *)&local_548) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b8,"uniform mediump float u_",0x18);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3b8,*(char **)(p_Var17 + 1),(long)p_Var17[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
      p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
    } while (p_Var17 != (_Rb_tree_node_base *)&local_548);
  }
  std::__cxx11::stringbuf::str();
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_550);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
  std::ios_base::~ios_base(local_348);
  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,(char *)local_578.m_log,local_570);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
  if (local_578.m_log != local_568) {
    operator_delete(local_578.m_log,(ulong)((long)&(local_568[0].m_log)->flags + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"void main (void)\n{\n\tmediump vec4 color = vec4(0.0);\n\n",0x35)
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
  pAVar27 = (attributes->
            super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pAVar27 !=
      (attributes->
      super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pCVar29 = &pAVar27->m_cond;
      uVar24 = 0;
      local_550 = (undefined1  [8])((ulong)local_550 & 0xffffffffffffff00);
      local_540[8] = '_';
      local_540[9] = '_';
      local_540[10] = 'a';
      local_540._11_4_ = 0x7961776c;
      local_540[0xf] = 's';
      local_540._0_4_ = 10;
      local_540._4_4_ = 0;
      local_530 = 0x5f5f;
      local_548._M_p = local_540 + 8;
      bVar8 = AttributeLocationTestUtil::Cond::operator==(pCVar29,(Cond *)local_550);
      if (local_548._M_p != local_540 + 8) {
        operator_delete(local_548._M_p,
                        CONCAT17(local_540[0xf],
                                 CONCAT43(local_540._11_4_,
                                          CONCAT12(local_540[10],CONCAT11(local_540[9],local_540[8])
                                                  ))) + 1);
      }
      if (bVar8) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3b8,"\tif (0 != 0)\n\t{\n",0x10);
        iVar9 = (int)uVar24;
        if (pAVar27->m_arraySize == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3b8,"\t\tcolor += ",0xb);
          (anonymous_namespace)::generateToVec4Expression_abi_cxx11_
                    ((string *)local_550,(_anonymous_namespace_ *)pAVar27,(Attribute *)0xffffffff,
                     iVar9);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3b8,(char *)local_550,(long)local_548._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,";\n",2);
LAB_004cc450:
          if (local_550 != (undefined1  [8])local_540) {
            operator_delete((void *)local_550,CONCAT44(local_540._4_4_,local_540._0_4_) + 1);
          }
        }
        else if (0 < pAVar27->m_arraySize) {
          pAVar30 = (Attribute *)0x0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3b8,"\t\tcolor += ",0xb);
            (anonymous_namespace)::generateToVec4Expression_abi_cxx11_
                      ((string *)local_550,(_anonymous_namespace_ *)pAVar27,pAVar30,(int)uVar24);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3b8,(char *)local_550,(long)local_548._M_p);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,";\n",2);
            if (local_550 != (undefined1  [8])local_540) {
              operator_delete((void *)local_550,CONCAT44(local_540._4_4_,local_540._0_4_) + 1);
            }
            uVar28 = (int)pAVar30 + 1;
            pAVar30 = (Attribute *)(ulong)uVar28;
          } while ((int)uVar28 < pAVar27->m_arraySize);
        }
LAB_004cc475:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8,"\t}\n",3);
      }
      else {
        local_550[0] = 1;
        local_540[8] = '_';
        local_540[9] = '_';
        local_540[10] = 'a';
        local_540._11_4_ = 0x7961776c;
        local_540[0xf] = 's';
        local_540._0_4_ = 10;
        local_540._4_4_ = 0;
        local_530 = 0x5f5f;
        local_548._M_p = local_540 + 8;
        bVar8 = AttributeLocationTestUtil::Cond::operator==(pCVar29,(Cond *)local_550);
        if (local_548._M_p != local_540 + 8) {
          operator_delete(local_548._M_p,
                          CONCAT17(local_540[0xf],
                                   CONCAT43(local_540._11_4_,
                                            CONCAT12(local_540[10],
                                                     CONCAT11(local_540[9],local_540[8])))) + 1);
        }
        iVar9 = (int)uVar24;
        if (!bVar8) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8,"\tif (u_",7);
          local_550 = (undefined1  [8])local_540;
          pcVar20 = (pAVar27->m_cond).m_name._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_550,pcVar20,pcVar20 + (pAVar27->m_cond).m_name._M_string_length
                    );
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3b8,(char *)local_550,(long)local_548._M_p);
          pcVar25 = " == ";
          if (pCVar29->m_negate != false) {
            pcVar25 = " != ";
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar25,4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"0.0)\n\t{\n",8);
          if (local_550 != (undefined1  [8])local_540) {
            operator_delete((void *)local_550,CONCAT44(local_540._4_4_,local_540._0_4_) + 1);
          }
          iVar9 = (int)uVar24;
          if (pAVar27->m_arraySize == -1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3b8,"\t\tcolor += ",0xb);
            (anonymous_namespace)::generateToVec4Expression_abi_cxx11_
                      ((string *)local_550,(_anonymous_namespace_ *)pAVar27,(Attribute *)0xffffffff,
                       iVar9);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3b8,(char *)local_550,(long)local_548._M_p);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,";\n",2);
            goto LAB_004cc450;
          }
          if (0 < pAVar27->m_arraySize) {
            pAVar30 = (Attribute *)0x0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3b8,"\t\tcolor += ",0xb);
              (anonymous_namespace)::generateToVec4Expression_abi_cxx11_
                        ((string *)local_550,(_anonymous_namespace_ *)pAVar27,pAVar30,(int)uVar24);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3b8,(char *)local_550,(long)local_548._M_p);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,";\n",2);
              if (local_550 != (undefined1  [8])local_540) {
                operator_delete((void *)local_550,CONCAT44(local_540._4_4_,local_540._0_4_) + 1);
              }
              uVar28 = (int)pAVar30 + 1;
              pAVar30 = (Attribute *)(ulong)uVar28;
            } while ((int)uVar28 < pAVar27->m_arraySize);
          }
          goto LAB_004cc475;
        }
        if (pAVar27->m_arraySize == -1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8,"\tcolor += ",10);
          (anonymous_namespace)::generateToVec4Expression_abi_cxx11_
                    ((string *)local_550,(_anonymous_namespace_ *)pAVar27,(Attribute *)0xffffffff,
                     iVar9);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3b8,(char *)local_550,(long)local_548._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,";\n",2);
          if (local_550 != (undefined1  [8])local_540) {
            operator_delete((void *)local_550,CONCAT44(local_540._4_4_,local_540._0_4_) + 1);
          }
        }
        else if (0 < pAVar27->m_arraySize) {
          pAVar30 = (Attribute *)0x0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3b8,"\tcolor += ",10);
            (anonymous_namespace)::generateToVec4Expression_abi_cxx11_
                      ((string *)local_550,(_anonymous_namespace_ *)pAVar27,pAVar30,(int)uVar24);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3b8,(char *)local_550,(long)local_548._M_p);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,";\n",2);
            if (local_550 != (undefined1  [8])local_540) {
              operator_delete((void *)local_550,CONCAT44(local_540._4_4_,local_540._0_4_) + 1);
            }
            uVar28 = (int)pAVar30 + 1;
            pAVar30 = (Attribute *)(ulong)uVar28;
          } while ((int)uVar28 < pAVar27->m_arraySize);
        }
      }
      pAVar27 = pAVar27 + 1;
    } while (pAVar27 !=
             (attributes->
             super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
  std::ios_base::~ios_base(local_348);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(char *)local_5f0._0_8_,local_5f0._8_8_);
  if ((undefined1 *)local_5f0._0_8_ != local_5f0 + 0x10) {
    operator_delete((void *)local_5f0._0_8_,local_5f0._16_8_ + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\n\tv_color = color;\n\tgl_Position = color;\n}\n",0x2b);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  tcu::StringTemplate::StringTemplate(&local_238,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  local_3b0._0_8_ = (ulong)(uint)local_3b0._4_4_ << 0x20;
  local_3b0._8_8_ = (_Base_ptr)0x0;
  local_390 = 0;
  local_3b0._16_8_ = (_Base_ptr)local_3b0;
  local_398 = (_Base_ptr)local_3b0;
  pcVar18 = glu::getGLSLVersionDeclaration(local_554);
  local_540._0_4_ = 0x53524556;
  local_548._M_p = (pointer)0x7;
  local_540._4_4_ = 0x4e4f49;
  local_550 = (undefined1  [8])local_540;
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,(key_type *)local_550);
  pcVar25 = (char *)pmVar19->_M_string_length;
  strlen(pcVar18);
  std::__cxx11::string::_M_replace((ulong)pmVar19,0,pcVar25,(ulong)pcVar18);
  if (local_550 != (undefined1  [8])local_540) {
    operator_delete((void *)local_550,CONCAT44(local_540._4_4_,local_540._0_4_) + 1);
  }
  local_540._0_4_ = 0x5f585456;
  local_540._4_4_ = 0x5054554f;
  local_540[8] = 'U';
  local_540[9] = 'T';
  local_548._M_p = (pointer)0xa;
  local_540[10] = '\0';
  local_550 = (undefined1  [8])local_540;
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,(key_type *)local_550);
  pcVar18 = "varying";
  pcVar25 = "varying";
  if (bVar6) {
    pcVar25 = "out";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar19,0,(char *)pmVar19->_M_string_length,(ulong)pcVar25);
  if (local_550 != (undefined1  [8])local_540) {
    operator_delete((void *)local_550,CONCAT44(local_540._4_4_,local_540._0_4_) + 1);
  }
  local_540._0_4_ = 0x5f585456;
  local_540._4_4_ = 0x55504e49;
  local_540[8] = 'T';
  local_540[9] = '\0';
  local_548._M_p = (pointer)0x9;
  local_550 = (undefined1  [8])local_540;
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,(key_type *)local_550);
  pcVar25 = "attribute";
  if (bVar6) {
    pcVar25 = "in";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar19,0,(char *)pmVar19->_M_string_length,(ulong)pcVar25);
  if (local_550 != (undefined1  [8])local_540) {
    operator_delete((void *)local_550,CONCAT44(local_540._4_4_,local_540._0_4_) + 1);
  }
  local_540._0_4_ = 0x47415246;
  local_540._4_4_ = 0x504e495f;
  local_540[8] = 'U';
  local_540[9] = 'T';
  local_548._M_p = (pointer)0xa;
  local_540[10] = '\0';
  local_550 = (undefined1  [8])local_540;
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,(key_type *)local_550);
  pcVar25 = "varying";
  if (bVar6) {
    pcVar25 = "in";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar19,0,(char *)pmVar19->_M_string_length,(ulong)pcVar25);
  if (local_550 != (undefined1  [8])local_540) {
    operator_delete((void *)local_550,CONCAT44(local_540._4_4_,local_540._0_4_) + 1);
  }
  local_540._0_4_ = 0x47415246;
  local_540._4_4_ = 0x54554f5f;
  local_540[8] = 'P';
  local_540[9] = 'U';
  local_540[10] = 'T';
  local_540._11_4_ = 0x5241565f;
  local_548._M_p = (pointer)0xf;
  local_540[0xf] = '\0';
  local_550 = (undefined1  [8])local_540;
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,(key_type *)local_550);
  pcVar25 = "gl_FragColor";
  if (bVar6) {
    pcVar25 = "dEQP_FragColor";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar19,0,(char *)pmVar19->_M_string_length,(ulong)pcVar25);
  if (local_550 != (undefined1  [8])local_540) {
    operator_delete((void *)local_550,CONCAT44(local_540._4_4_,local_540._0_4_) + 1);
  }
  pcVar25 = "";
  if (bVar6) {
    pcVar25 = "layout(location=0) out mediump vec4 dEQP_FragColor;";
  }
  local_1a8[0]._M_dataplus._M_p = (pointer)0x17;
  local_550 = (undefined1  [8])local_540;
  local_550 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_550,(ulong)local_1a8);
  local_540._0_4_ = SUB84(local_1a8[0]._M_dataplus._M_p,0);
  local_540._4_4_ = (undefined4)((ulong)local_1a8[0]._M_dataplus._M_p >> 0x20);
  builtin_strncpy((char *)local_550,"FRAG_OUTPUT_DECLARATION",0x17);
  local_548._M_p = local_1a8[0]._M_dataplus._M_p;
  *(char *)((long)local_550 + (long)local_1a8[0]._M_dataplus._M_p) = '\0';
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,(key_type *)local_550);
  std::__cxx11::string::_M_replace
            ((ulong)pmVar19,0,(char *)pmVar19->_M_string_length,(ulong)pcVar25);
  if (local_550 != (undefined1  [8])local_540) {
    operator_delete((void *)local_550,CONCAT44(local_540._4_4_,local_540._0_4_) + 1);
  }
  tcu::StringTemplate::specialize
            (&local_208,&local_238,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_3b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_3b8);
  tcu::StringTemplate::~StringTemplate(&local_238);
  CVar10.super_ApiType.m_bits = (ApiType)(*local_218->_vptr_RenderContext[2])();
  GVar11 = glu::getContextTypeGLSLVersion(CVar10);
  if ((char)local_558 != '\0') {
    bVar6 = glu::glslVersionIsES(GVar11);
    version = GLSL_VERSION_100_ES;
    if (bVar6) goto LAB_004cc98a;
  }
  version = GVar11;
LAB_004cc98a:
  local_3b8 = (undefined1  [8])(local_3b0 + 8);
  local_1a8[0]._M_dataplus._M_p = (pointer)0x7e;
  pcVar20 = (pointer)std::__cxx11::string::_M_create((ulong *)local_3b8,(ulong)local_1a8);
  _Var5._M_p = local_1a8[0]._M_dataplus._M_p;
  local_3b0._8_8_ = local_1a8[0]._M_dataplus._M_p;
  local_3b8 = (undefined1  [8])pcVar20;
  memcpy(pcVar20,
         "${VERSION}\n${FRAG_OUTPUT_DECLARATION}\n${FRAG_INPUT} mediump vec4 v_color;\nvoid main (void)\n{\n\t${FRAG_OUTPUT_VAR} = v_color;\n}\n"
         ,0x7e);
  local_3b0._0_8_ = _Var5._M_p;
  pcVar20[_Var5._M_p] = '\0';
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_550,(string *)local_3b8);
  if (local_3b8 != (undefined1  [8])(local_3b0 + 8)) {
    operator_delete((void *)local_3b8,(ulong)(local_3b0._8_8_ + 1));
  }
  bVar6 = glu::glslVersionUsesInOutQualifiers(version);
  local_3b0._0_8_ = local_3b0._0_8_ & 0xffffffff00000000;
  local_3b0._8_8_ = (_Base_ptr)0x0;
  local_390 = 0;
  local_3b0._16_8_ = (_Base_ptr)local_3b0;
  local_398 = (_Base_ptr)local_3b0;
  __s = glu::getGLSLVersionDeclaration(version);
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  local_1a8[0].field_2._M_allocated_capacity._0_4_ = 0x53524556;
  local_1a8[0]._M_string_length = 7;
  local_1a8[0].field_2._M_allocated_capacity._4_4_ = 0x4e4f49;
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,local_1a8);
  pcVar25 = (char *)pmVar19->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)pmVar19,0,pcVar25,(ulong)__s);
  paVar1 = &local_1a8[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,
                    CONCAT44(local_1a8[0].field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_1a8[0].field_2._M_allocated_capacity) + 1);
  }
  local_1a8[0].field_2._M_allocated_capacity._0_4_ = 0x5f585456;
  local_1a8[0].field_2._M_allocated_capacity._4_4_ = 0x5054554f;
  local_1a8[0].field_2._8_2_ = 0x5455;
  local_1a8[0]._M_string_length = 10;
  local_1a8[0].field_2._M_local_buf[10] = '\0';
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,local_1a8);
  pcVar25 = "out";
  if (!bVar6) {
    pcVar25 = "varying";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar19,0,(char *)pmVar19->_M_string_length,(ulong)pcVar25);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,
                    CONCAT44(local_1a8[0].field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_1a8[0].field_2._M_allocated_capacity) + 1);
  }
  local_1a8[0].field_2._M_allocated_capacity._0_4_ = 0x5f585456;
  local_1a8[0].field_2._M_allocated_capacity._4_4_ = 0x55504e49;
  local_1a8[0].field_2._8_2_ = 0x54;
  local_1a8[0]._M_string_length = 9;
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,local_1a8);
  pcVar25 = "attribute";
  if (bVar6) {
    pcVar25 = "in";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar19,0,(char *)pmVar19->_M_string_length,(ulong)pcVar25);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,
                    CONCAT44(local_1a8[0].field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_1a8[0].field_2._M_allocated_capacity) + 1);
  }
  local_1a8[0].field_2._M_allocated_capacity._0_4_ = 0x47415246;
  local_1a8[0].field_2._M_allocated_capacity._4_4_ = 0x504e495f;
  local_1a8[0].field_2._8_2_ = 0x5455;
  local_1a8[0]._M_string_length = 10;
  local_1a8[0].field_2._M_local_buf[10] = '\0';
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,local_1a8);
  if (bVar6) {
    pcVar18 = "in";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar19,0,(char *)pmVar19->_M_string_length,(ulong)pcVar18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,
                    CONCAT44(local_1a8[0].field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_1a8[0].field_2._M_allocated_capacity) + 1);
  }
  local_1a8[0].field_2._M_allocated_capacity._0_4_ = 0x47415246;
  local_1a8[0].field_2._M_allocated_capacity._4_4_ = 0x54554f5f;
  local_1a8[0].field_2._8_2_ = 0x5550;
  local_1a8[0].field_2._M_local_buf[10] = 'T';
  local_1a8[0].field_2._11_4_ = 0x5241565f;
  local_1a8[0]._M_string_length = 0xf;
  local_1a8[0].field_2._M_local_buf[0xf] = '\0';
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,local_1a8);
  pcVar18 = "";
  pcVar25 = "gl_FragColor";
  if (bVar6) {
    pcVar25 = "dEQP_FragColor";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar19,0,(char *)pmVar19->_M_string_length,(ulong)pcVar25);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,
                    CONCAT44(local_1a8[0].field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_1a8[0].field_2._M_allocated_capacity) + 1);
  }
  if (bVar6) {
    pcVar18 = "layout(location=0) out mediump vec4 dEQP_FragColor;";
  }
  local_598._M_dataplus._M_p = (char *)0x17;
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
  local_1a8[0]._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)local_1a8,(ulong)&local_598);
  local_1a8[0].field_2._M_allocated_capacity._0_4_ = SUB84(local_598._M_dataplus._M_p,0);
  local_1a8[0].field_2._M_allocated_capacity._4_4_ =
       (undefined4)((ulong)local_598._M_dataplus._M_p >> 0x20);
  builtin_strncpy(local_1a8[0]._M_dataplus._M_p,"FRAG_OUTPUT_DECLARATION",0x17);
  local_1a8[0]._M_string_length = (size_type)local_598._M_dataplus._M_p;
  local_1a8[0]._M_dataplus._M_p[(long)local_598._M_dataplus._M_p] = '\0';
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,local_1a8);
  std::__cxx11::string::_M_replace
            ((ulong)pmVar19,0,(char *)pmVar19->_M_string_length,(ulong)pcVar18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,
                    CONCAT44(local_1a8[0].field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_1a8[0].field_2._M_allocated_capacity) + 1);
  }
  tcu::StringTemplate::specialize
            ((string *)local_5f0,(StringTemplate *)local_550,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_3b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_3b8);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_550);
  pVar21.first = (**(code **)(this + 0x3f0))(0x8b31);
  uVar28 = (**(code **)(this + 0x3f0))(0x8b30);
  pcVar25 = local_3b0 + 8;
  dVar12 = (**(code **)(this + 0x800))();
  glu::checkError(dVar12,"glCreateShader()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x1a7);
  local_3b8 = (undefined1  [8])local_208._M_dataplus._M_p;
  local_550 = (undefined1  [8])local_5f0._0_8_;
  (**(code **)(this + 0x12b8))(pVar21.first,1,local_3b8,0);
  (**(code **)(this + 0x12b8))(uVar28,1,local_550,0);
  dVar12 = (**(code **)(this + 0x800))();
  glu::checkError(dVar12,"glShaderSource()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x1b0);
  (**(code **)(this + 0x248))(pVar21.first);
  (**(code **)(this + 0x248))(uVar28);
  dVar12 = (**(code **)(this + 0x800))();
  glu::checkError(dVar12,"glCompileShader()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x1b5);
  (**(code **)(this + 0x10))(local_5c4,pVar21.first);
  (**(code **)(this + 0x10))(local_5c4,uVar28);
  dVar12 = (**(code **)(this + 0x800))();
  glu::checkError(dVar12,"glAttachShader()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x1b9);
  (**(code **)(this + 0xa70))(pVar21.first,0x8b81,local_3b8);
  dVar12 = (**(code **)(this + 0x800))();
  glu::checkError(dVar12,"glGetShaderiv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x148);
  uVar3 = local_3b8._0_4_;
  (**(code **)(this + 0xa70))(uVar28,0x8b81);
  dVar12 = (**(code **)(this + 0x800))();
  shader = 0x148;
  glu::checkError(dVar12,"glGetShaderiv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x148);
  uVar4 = local_3b8._0_4_;
  (anonymous_namespace)::getShaderInfoLog_abi_cxx11_
            (local_1a8,this,(Functions *)(ulong)pVar21.first,shader);
  (anonymous_namespace)::getShaderInfoLog_abi_cxx11_
            (&local_598,this,(Functions *)(ulong)uVar28,shader);
  local_550 = (undefined1  [8])0x12;
  local_3b8 = (undefined1  [8])pcVar25;
  local_3b8 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_3b8,(ulong)local_550);
  local_3b0._8_8_ = local_550;
  builtin_strncpy((char *)local_3b8,"Vertex Shader Info",0x12);
  local_3b0._0_8_ = local_550;
  *(char *)((long)local_3b8 + (long)local_550) = '\0';
  local_550 = (undefined1  [8])local_540;
  local_578.m_log = (TestLog *)0x12;
  local_550 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_550,(ulong)&local_578)
  ;
  local_540._0_4_ = SUB84(local_578.m_log,0);
  local_540._4_4_ = (undefined4)((ulong)local_578.m_log >> 0x20);
  builtin_strncpy((char *)local_550,"Vertex Shader Info",0x12);
  local_548._M_p = (pointer)local_578.m_log;
  *(char *)((long)local_550 + (long)local_578.m_log) = '\0';
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_238,log,(string *)local_3b8,(string *)local_550);
  if (local_550 != (undefined1  [8])local_540) {
    operator_delete((void *)local_550,CONCAT44(local_540._4_4_,local_540._0_4_) + 1);
  }
  if (local_3b8 != (undefined1  [8])pcVar25) {
    operator_delete((void *)local_3b8,(ulong)(local_3b0._8_8_ + 1));
  }
  local_3b8 = (undefined1  [8])pcVar25;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_208._M_dataplus._M_p,
             local_208._M_dataplus._M_p + local_208._M_string_length);
  tcu::TestLog::writeKernelSource(log,(char *)local_3b8);
  if (local_3b8 != (undefined1  [8])pcVar25) {
    operator_delete((void *)local_3b8,(ulong)(local_3b0._8_8_ + 1));
  }
  local_3b0._8_8_ = (_Base_ptr)0x676f4c206f666e49;
  local_3b0._0_8_ = 8;
  local_3b0._16_8_ = local_3b0._16_8_ & 0xffffffffffffff00;
  local_540._0_4_ = 0x6f666e49;
  local_540._4_4_ = 0x676f4c20;
  local_548._M_p = (pointer)0x8;
  local_540[8] = '\0';
  local_550 = (undefined1  [8])local_540;
  local_3b8 = (undefined1  [8])pcVar25;
  tcu::ScopedLogSection::ScopedLogSection(&local_578,log,(string *)local_3b8,(string *)local_550);
  if (local_550 != (undefined1  [8])local_540) {
    operator_delete((void *)local_550,CONCAT44(local_540._4_4_,local_540._0_4_) + 1);
  }
  if (local_3b8 != (undefined1  [8])(local_3b0 + 8)) {
    operator_delete((void *)local_3b8,(ulong)(local_3b0._8_8_ + 1));
  }
  local_3b8 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3b0,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_3b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
  std::ios_base::~ios_base(local_340);
  tcu::TestLog::endSection(local_578.m_log);
  local_3b8 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3b0,"Compilation result: ",0x14);
  pcVar25 = "Failed";
  pcVar18 = "Failed";
  if (uVar3 == 1) {
    pcVar18 = "Ok";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3b0,pcVar18,(ulong)(uVar3 != 1) * 4 + 2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_3b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
  std::ios_base::~ios_base(local_340);
  tcu::TestLog::endSection((TestLog *)local_238.m_template._M_dataplus._M_p);
  pcVar18 = local_3b0 + 8;
  local_550 = (undefined1  [8])0x14;
  local_3b8 = (undefined1  [8])pcVar18;
  local_3b8 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_3b8,(ulong)local_550);
  local_3b0._8_8_ = local_550;
  builtin_strncpy((char *)local_3b8,"Fragment Shader Info",0x14);
  local_3b0._0_8_ = local_550;
  *(char *)((long)local_3b8 + (long)local_550) = '\0';
  local_550 = (undefined1  [8])local_540;
  local_578.m_log = (TestLog *)0x14;
  local_550 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_550,(ulong)&local_578)
  ;
  local_540._0_4_ = SUB84(local_578.m_log,0);
  local_540._4_4_ = (undefined4)((ulong)local_578.m_log >> 0x20);
  builtin_strncpy((char *)local_550,"Fragment Shader Info",0x14);
  local_548._M_p = (pointer)local_578.m_log;
  *(char *)((long)local_550 + (long)local_578.m_log) = '\0';
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_238,log,(string *)local_3b8,(string *)local_550);
  if (local_550 != (undefined1  [8])local_540) {
    operator_delete((void *)local_550,CONCAT44(local_540._4_4_,local_540._0_4_) + 1);
  }
  if (local_3b8 != (undefined1  [8])pcVar18) {
    operator_delete((void *)local_3b8,(ulong)(local_3b0._8_8_ + 1));
  }
  local_3b8 = (undefined1  [8])pcVar18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_5f0._0_8_,(char *)(local_5f0._8_8_ + local_5f0._0_8_));
  tcu::TestLog::writeKernelSource(log,(char *)local_3b8);
  if (local_3b8 != (undefined1  [8])pcVar18) {
    operator_delete((void *)local_3b8,(ulong)(local_3b0._8_8_ + 1));
  }
  local_3b0._8_8_ = (_Base_ptr)0x676f4c206f666e49;
  local_3b0._0_8_ = 8;
  local_3b0._16_8_ = local_3b0._16_8_ & 0xffffffffffffff00;
  local_540._0_4_ = 0x6f666e49;
  local_540._4_4_ = 0x676f4c20;
  local_548._M_p = (pointer)0x8;
  local_540[8] = '\0';
  local_550 = (undefined1  [8])local_540;
  local_3b8 = (undefined1  [8])pcVar18;
  tcu::ScopedLogSection::ScopedLogSection(&local_578,log,(string *)local_3b8,(string *)local_550);
  if (local_550 != (undefined1  [8])local_540) {
    operator_delete((void *)local_550,CONCAT44(local_540._4_4_,local_540._0_4_) + 1);
  }
  if (local_3b8 != (undefined1  [8])(local_3b0 + 8)) {
    operator_delete((void *)local_3b8,(ulong)(local_3b0._8_8_ + 1));
  }
  local_3b8 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3b0,local_598._M_dataplus._M_p,local_598._M_string_length);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_3b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
  std::ios_base::~ios_base(local_340);
  tcu::TestLog::endSection(local_578.m_log);
  local_3b8 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3b0,"Compilation result: ",0x14);
  if (uVar4 == 1) {
    pcVar25 = "Ok";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3b0,pcVar25,(ulong)(uVar4 != 1) * 4 + 2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_3b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
  std::ios_base::~ios_base(local_340);
  tcu::TestLog::endSection((TestLog *)local_238.m_template._M_dataplus._M_p);
  if (uVar3 == 1) {
    if (uVar4 == 1) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._M_dataplus._M_p != &local_598.field_2) {
        operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,
                        CONCAT44(local_1a8[0].field_2._M_allocated_capacity._4_4_,
                                 (undefined4)local_1a8[0].field_2._M_allocated_capacity) + 1);
      }
      (**(code **)(this + 0x470))(pVar21.first);
      (**(code **)(this + 0x470))(uVar28);
      if ((undefined1 *)local_5f0._0_8_ != local_5f0 + 0x10) {
        operator_delete((void *)local_5f0._0_8_,local_5f0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      pVar21.second = uVar28;
      return pVar21;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Fragment shader compilation failed","fragmentCompileOk",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
               ,0x1c5);
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Vertex shader compilation failed","vertexCompileOk",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
               ,0x1c4);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

pair<deUint32, deUint32> createAndAttachShaders (TestLog& log, glu::RenderContext& renderCtx, deUint32 program, const vector<Attribute>& attributes, bool attributeAliasing)
{
	const glw::Functions&	gl						= renderCtx.getFunctions();
	const string			vertexShaderSource		= createVertexShaderSource(renderCtx, attributes, attributeAliasing);
	const string			fragmentShaderSource	= createFragmentShaderSource(renderCtx, attributeAliasing);

	const deUint32			vertexShader			= gl.createShader(GL_VERTEX_SHADER);
	const deUint32			fragmentShader			= gl.createShader(GL_FRAGMENT_SHADER);

	try
	{
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader()");

		{
			const char* const vertexShaderString	= vertexShaderSource.c_str();
			const char* const fragmentShaderString	= fragmentShaderSource.c_str();

			gl.shaderSource(vertexShader, 1, &vertexShaderString, DE_NULL);
			gl.shaderSource(fragmentShader, 1, &fragmentShaderString, DE_NULL);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource()");
		}

		gl.compileShader(vertexShader);
		gl.compileShader(fragmentShader);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader()");

		gl.attachShader(program, vertexShader);
		gl.attachShader(program, fragmentShader);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader()");

		{
			const bool		vertexCompileOk			= getShaderCompileStatus(gl, vertexShader);
			const bool		fragmentCompileOk		= getShaderCompileStatus(gl, fragmentShader);

			const string	vertexShaderInfoLog		= getShaderInfoLog(gl, vertexShader);
			const string	fragmentShaderInfoLog	= getShaderInfoLog(gl, fragmentShader);

			logShaders(log, vertexShaderSource, vertexShaderInfoLog, vertexCompileOk, fragmentShaderSource, fragmentShaderInfoLog, fragmentCompileOk);

			TCU_CHECK_MSG(vertexCompileOk, "Vertex shader compilation failed");
			TCU_CHECK_MSG(fragmentCompileOk, "Fragment shader compilation failed");
		}

		gl.deleteShader(vertexShader);
		gl.deleteShader(fragmentShader);

		return pair<deUint32, deUint32>(vertexShader, fragmentShader);
	}
	catch (...)
	{
		if (vertexShader != 0)
			gl.deleteShader(vertexShader);

		if (fragmentShader != 0)
			gl.deleteShader(fragmentShader);

		throw;
	}
}